

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

PackageMempoolAcceptResult * __thiscall
anon_unknown.dwarf_2401980::MemPoolAccept::AcceptPackage
          (PackageMempoolAcceptResult *__return_storage_ptr__,MemPoolAccept *this,Package *package,
          ATMPArgs *args)

{
  long lVar1;
  anon_class_16_2_e24924d3 __pred;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  TxValidationResult TVar5;
  size_type sVar6;
  const_iterator cVar7;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  _Var8;
  MempoolAcceptResult *__args_1;
  size_type sVar9;
  mapped_type *pmVar10;
  pointer ppVar11;
  PackageValidationState *state;
  long in_FS_OFFSET;
  insert_iterator<std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>_>
  iVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>,_bool> pVar13;
  undefined4 in_stack_ffffffffffffeeb8;
  int in_stack_ffffffffffffeebc;
  value_type *in_stack_ffffffffffffeec0;
  MempoolAcceptResult *in_stack_ffffffffffffeec8;
  undefined4 in_stack_ffffffffffffeed0;
  PackageValidationResult in_stack_ffffffffffffeed4;
  _Node_iterator_base<uint256,_true> in_stack_ffffffffffffeed8;
  iterator in_stack_ffffffffffffeee0;
  undefined4 in_stack_ffffffffffffeee8;
  int in_stack_ffffffffffffeeec;
  MemPoolAccept *in_stack_ffffffffffffeef0;
  MempoolAcceptResult *in_stack_ffffffffffffeef8;
  __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
  in_stack_ffffffffffffef00;
  __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
  in_stack_ffffffffffffef08;
  CCoinsViewCache *in_stack_ffffffffffffef18;
  CTxMemPool *in_stack_ffffffffffffef20;
  Package *in_stack_ffffffffffffef70;
  byte local_1049;
  undefined1 require_sorted;
  PackageValidationState *in_stack_fffffffffffff008;
  undefined7 in_stack_fffffffffffff010;
  undefined1 in_stack_fffffffffffff017;
  PackageMempoolAcceptResult *local_f70;
  mapped_type *txresult;
  Wtxid *wtxid_1;
  shared_ptr<const_CTransaction> *tx_1;
  Package *__range1_2;
  PackageValidationState *package_state_final;
  mapped_type *single_res;
  CTxMemPoolEntry *entry_1;
  CTxMemPoolEntry *entry;
  Txid *txid;
  Wtxid *wtxid;
  shared_ptr<const_CTransaction> *tx;
  Package *__range1_1;
  bool quit_early;
  CTxIn *input;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  CCoinsViewCache *coins_tip_cache;
  value_type *child;
  ATMPArgs *args_local;
  Package *package_local;
  MemPoolAccept *this_local;
  iterator it_1;
  undefined1 local_cc6 [2];
  allocator<char> local_cc4;
  undefined1 local_cc3 [11];
  iterator it;
  allocator<char> local_cad;
  allocator<char> local_cac;
  allocator<char> local_cab;
  allocator<char> local_caa;
  uchar local_ca9;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  allocator<char> local_c93;
  allocator<char> local_c92 [26];
  CTxMemPoolEntry *local_c78;
  CTxMemPoolEntry *local_c70;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  txns_package_eval;
  allocator<char> local_c3a;
  allocator<char> local_c39;
  MemPoolAccept *local_c38;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  *puStack_c30;
  anon_class_16_2_e24924d3 package_or_confirmed;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  unconfirmed_parent_txids;
  allocator<char> local_bb2;
  allocator<char> local_bb1;
  _Base_ptr local_bb0;
  undefined1 local_ba8;
  _Base_ptr local_ba0;
  undefined1 local_b98;
  _Base_ptr local_b90;
  undefined1 local_b88;
  _Base_ptr local_b80;
  undefined1 local_b78;
  _Base_ptr local_b70;
  undefined1 local_b68;
  _Base_ptr local_b60;
  undefined1 local_b58;
  _Base_ptr local_b50;
  undefined1 local_b48;
  _Base_ptr local_b40;
  undefined1 local_b38;
  _Base_ptr local_b30;
  undefined1 local_b28;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  TxValidationState mempool_full_state_1;
  TxValidationState mempool_full_state;
  PackageMempoolAcceptResult multi_submission_result;
  undefined1 local_540 [16];
  PackageMempoolAcceptResult single_package_res;
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  individual_results_nonfinal;
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  results_final;
  PackageValidationState package_state_quit_early;
  
  require_sorted = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             in_stack_ffffffffffffeebc,(AnnotatedMixin<std::recursive_mutex> *)0x14ba879);
  PackageValidationState::PackageValidationState
            ((PackageValidationState *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8)
            );
  bVar3 = IsWellFormedPackage((Package *)
                              CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010),
                              in_stack_fffffffffffff008,(bool)require_sorted);
  if (bVar3) {
    bVar3 = IsChildWithParents(in_stack_ffffffffffffef70);
    if (bVar3) {
      sVar6 = std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
      if (sVar6 < 2) {
        __assert_fail("package.size() > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x6a3,
                      "PackageMempoolAcceptResult (anonymous namespace)::MemPoolAccept::AcceptPackage(const Package &, ATMPArgs &)"
                     );
      }
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
      std::
      unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>::
      unordered_set((unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
                     *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
      cVar7 = std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::cbegin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)in_stack_ffffffffffffeec0);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::cend((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)in_stack_ffffffffffffeec0);
      _Var8 = __gnu_cxx::
              __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
              ::operator-((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                           *)in_stack_ffffffffffffeec8,(difference_type)in_stack_ffffffffffffeec0);
      std::
      unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>::
      end((unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
           *)in_stack_ffffffffffffeec0);
      iVar12 = std::
               inserter<std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>_>
                         ((unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
                           *)in_stack_ffffffffffffeec8,
                          (__range_iter_t<std::unordered_set<uint256,_SaltedTxidHasher>_>)
                          in_stack_ffffffffffffeed8._M_cur);
      std::
      transform<__gnu_cxx::__normal_iterator<std::shared_ptr<CTransaction_const>const*,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>,std::insert_iterator<std::unordered_set<uint256,SaltedTxidHasher,std::equal_to<uint256>,std::allocator<uint256>>>,(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__0>
                (cVar7._M_current,_Var8._M_current,iVar12.container,
                 iVar12.iter.super__Node_iterator_base<uint256,_true>._M_cur.
                 super__Node_iterator_base<uint256,_true>);
      Chainstate::CoinsTip((Chainstate *)in_stack_ffffffffffffeed8._M_cur);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
      std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffeec0);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffeec0);
      while (bVar3 = __gnu_cxx::
                     operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                 *)in_stack_ffffffffffffeec8,
                                (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                 *)in_stack_ffffffffffffeec0), ((bVar3 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
        operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                  CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        bVar3 = CCoinsViewCache::HaveCoinInCache
                          ((CCoinsViewCache *)
                           CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
                           (COutPoint *)in_stack_ffffffffffffeec8);
        if (!bVar3) {
          std::vector<COutPoint,_std::allocator<COutPoint>_>::push_back
                    ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffeec8,
                     in_stack_ffffffffffffeec0);
        }
        __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
        operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                   CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
      }
      Chainstate::CoinsTip((Chainstate *)in_stack_ffffffffffffeed8._M_cur);
      CCoinsViewBacked::SetBackend
                ((CCoinsViewBacked *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                 (CCoinsView *)0x14bae8b);
      package_or_confirmed.unconfirmed_parent_txids = &unconfirmed_parent_txids;
      package_or_confirmed.this = this;
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
      std::vector<CTxIn,_std::allocator<CTxIn>_>::cbegin
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffeec0);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
      std::vector<CTxIn,_std::allocator<CTxIn>_>::cend
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffeec0);
      local_c38 = package_or_confirmed.this;
      puStack_c30 = package_or_confirmed.unconfirmed_parent_txids;
      __pred.unconfirmed_parent_txids =
           (unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
            *)in_stack_ffffffffffffeef8;
      __pred.this = in_stack_ffffffffffffeef0;
      bVar3 = std::
              all_of<__gnu_cxx::__normal_iterator<CTxIn_const*,std::vector<CTxIn,std::allocator<CTxIn>>>,(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                        (in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,__pred);
      if (bVar3) {
        CCoinsViewBacked::SetBackend
                  ((CCoinsViewBacked *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8)
                   ,(CCoinsView *)0x14bb15b);
        MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                  ((AnnotatedMixin<std::recursive_mutex> *)
                   CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffeef8,
                   (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffeef0,
                   (char *)CONCAT44(in_stack_ffffffffffffeeec,in_stack_ffffffffffffeee8),
                   (char *)in_stack_ffffffffffffeee0._M_node,
                   (int)((ulong)in_stack_ffffffffffffeed8._M_cur >> 0x20),
                   SUB81((ulong)in_stack_ffffffffffffeed8._M_cur >> 0x18,0));
        std::
        map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
               *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        std::
        map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
               *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        bVar3 = false;
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)in_stack_ffffffffffffeec0);
        __end1_1 = std::
                   vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          *)in_stack_ffffffffffffeec0);
        while (bVar4 = __gnu_cxx::
                       operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                 ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                   *)in_stack_ffffffffffffeec8,
                                  (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                   *)in_stack_ffffffffffffeec0), ((bVar4 ^ 0xffU) & 1) != 0) {
          __gnu_cxx::
          __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
          ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                       *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
          std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
          CTransaction::GetWitnessHash
                    ((CTransaction *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
          std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
          CTransaction::GetHash
                    ((CTransaction *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
          transaction_identifier::operator_cast_to_uint256_
                    ((transaction_identifier<true> *)
                     CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
          GenTxid::Wtxid((uint256 *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
          bVar4 = CTxMemPool::exists(in_stack_ffffffffffffef20,(GenTxid *)in_stack_ffffffffffffef18)
          ;
          if (bVar4) {
            local_c70 = CTxMemPool::GetEntry
                                  ((CTxMemPool *)in_stack_ffffffffffffeed8._M_cur,
                                   (Txid *)CONCAT44(in_stack_ffffffffffffeed4,
                                                    in_stack_ffffffffffffeed0));
            inline_assertion_check<true,CTxMemPoolEntry_const*>
                      ((CTxMemPoolEntry **)in_stack_ffffffffffffeef8,
                       (char *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
                       (char *)in_stack_ffffffffffffeee0._M_node,
                       (char *)in_stack_ffffffffffffeed8._M_cur);
            CTxMemPoolEntry::GetTxSize
                      ((CTxMemPoolEntry *)
                       CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
            CTxMemPoolEntry::GetFee
                      ((CTxMemPoolEntry *)
                       CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
            MempoolAcceptResult::MempoolTx
                      ((int64_t)in_stack_ffffffffffffeec0,
                       CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
            pVar13 = std::
                     map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                     ::emplace<transaction_identifier<true>const&,MempoolAcceptResult>
                               ((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                                 *)in_stack_ffffffffffffeed8._M_cur,
                                (transaction_identifier<true> *)
                                CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
                                in_stack_ffffffffffffeec8);
            local_b30 = (_Base_ptr)pVar13.first._M_node;
            local_b28 = pVar13.second;
            MempoolAcceptResult::~MempoolAcceptResult
                      ((MempoolAcceptResult *)
                       CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
          }
          else {
            transaction_identifier::operator_cast_to_uint256_
                      ((transaction_identifier<false> *)
                       CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
            GenTxid::Txid((uint256 *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
            bVar4 = CTxMemPool::exists(in_stack_ffffffffffffef20,
                                       (GenTxid *)in_stack_ffffffffffffef18);
            if (bVar4) {
              local_c78 = CTxMemPool::GetEntry
                                    ((CTxMemPool *)in_stack_ffffffffffffeed8._M_cur,
                                     (Txid *)CONCAT44(in_stack_ffffffffffffeed4,
                                                      in_stack_ffffffffffffeed0));
              inline_assertion_check<true,CTxMemPoolEntry_const*>
                        ((CTxMemPoolEntry **)in_stack_ffffffffffffeef8,
                         (char *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
                         (char *)in_stack_ffffffffffffeee0._M_node,
                         (char *)in_stack_ffffffffffffeed8._M_cur);
              CTxMemPoolEntry::GetTx
                        ((CTxMemPoolEntry *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              CTransaction::GetWitnessHash
                        ((CTransaction *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              transaction_identifier::operator_cast_to_uint256_
                        ((transaction_identifier<true> *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              MempoolAcceptResult::MempoolTxDifferentWitness((uint256 *)in_stack_ffffffffffffeec0);
              pVar13 = std::
                       map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                       ::emplace<transaction_identifier<true>const&,MempoolAcceptResult>
                                 ((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                                   *)in_stack_ffffffffffffeed8._M_cur,
                                  (transaction_identifier<true> *)
                                  CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
                                  in_stack_ffffffffffffeec8);
              local_b40 = (_Base_ptr)pVar13.first._M_node;
              local_b38 = pVar13.second;
              MempoolAcceptResult::~MempoolAcceptResult
                        ((MempoolAcceptResult *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
            }
            else {
              std::shared_ptr<const_CTransaction>::shared_ptr
                        ((shared_ptr<const_CTransaction> *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                         (shared_ptr<const_CTransaction> *)0x14bb647);
              std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
                        ((allocator<std::shared_ptr<const_CTransaction>_> *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              __l._M_len = (size_type)in_stack_ffffffffffffef08._M_current;
              __l._M_array = (iterator)in_stack_ffffffffffffef00._M_current;
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)in_stack_ffffffffffffeef8,__l,(allocator_type *)in_stack_ffffffffffffeef0)
              ;
              AcceptSubPackage((MemPoolAccept *)in_stack_ffffffffffffef08._M_current,
                               (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                *)in_stack_ffffffffffffef00._M_current,
                               (ATMPArgs *)in_stack_ffffffffffffeef8);
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         *)in_stack_ffffffffffffeec8);
              std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
                        ((allocator<std::shared_ptr<const_CTransaction>_> *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              local_f70 = &single_package_res;
              do {
                local_f70 = (PackageMempoolAcceptResult *)
                            &local_f70[-1].m_tx_results._M_t._M_impl.super__Rb_tree_header._M_header
                             ._M_right;
                std::shared_ptr<const_CTransaction>::~shared_ptr
                          ((shared_ptr<const_CTransaction> *)
                           CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              } while (local_f70 != (PackageMempoolAcceptResult *)local_540);
              transaction_identifier::operator_cast_to_uint256_
                        ((transaction_identifier<true> *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              pmVar10 = std::
                        map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        ::at((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                              *)in_stack_ffffffffffffeee0._M_node,
                             (key_type *)in_stack_ffffffffffffeed8._M_cur);
              if (pmVar10->m_result_type == VALID) {
                transaction_identifier::operator_cast_to_uint256_
                          ((transaction_identifier<true> *)
                           CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
                GenTxid::Wtxid((uint256 *)
                               CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
                bVar4 = CTxMemPool::exists(in_stack_ffffffffffffef20,
                                           (GenTxid *)in_stack_ffffffffffffef18);
                if (!bVar4) {
                  __assert_fail("m_pool.exists(GenTxid::Wtxid(wtxid))",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                                ,0x6f5,
                                "PackageMempoolAcceptResult (anonymous namespace)::MemPoolAccept::AcceptPackage(const Package &, ATMPArgs &)"
                               );
                }
                pVar13 = std::
                         map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                         ::emplace<transaction_identifier<true>const&,MempoolAcceptResult_const&>
                                   ((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                                     *)in_stack_ffffffffffffeed8._M_cur,
                                    (transaction_identifier<true> *)
                                    CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
                                    in_stack_ffffffffffffeec8);
                local_b50 = (_Base_ptr)pVar13.first._M_node;
                local_b48 = pVar13.second;
              }
              else {
                TVar5 = ValidationState<TxValidationResult>::GetResult
                                  ((ValidationState<TxValidationResult> *)
                                   CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
                if ((TVar5 == TX_RECONSIDERABLE) ||
                   (TVar5 = ValidationState<TxValidationResult>::GetResult
                                      ((ValidationState<TxValidationResult> *)
                                       CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8)
                                      ), TVar5 == TX_MISSING_INPUTS)) {
                  pVar13 = std::
                           map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                           ::emplace<transaction_identifier<true>const&,MempoolAcceptResult_const&>
                                     ((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                                       *)in_stack_ffffffffffffeed8._M_cur,
                                      (transaction_identifier<true> *)
                                      CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
                                      in_stack_ffffffffffffeec8);
                  local_b70 = (_Base_ptr)pVar13.first._M_node;
                  local_b68 = pVar13.second;
                  std::
                  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               *)in_stack_ffffffffffffeec8,(value_type *)in_stack_ffffffffffffeec0);
                }
                else {
                  bVar3 = true;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffef08._M_current,
                             (char *)in_stack_ffffffffffffef00._M_current,
                             (allocator<char> *)in_stack_ffffffffffffeef8);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffef08._M_current,
                             (char *)in_stack_ffffffffffffef00._M_current,
                             (allocator<char> *)in_stack_ffffffffffffeef8);
                  ValidationState<PackageValidationResult>::Invalid
                            ((ValidationState<PackageValidationResult> *)
                             in_stack_ffffffffffffeed8._M_cur,in_stack_ffffffffffffeed4,
                             (string *)in_stack_ffffffffffffeec8,(string *)in_stack_ffffffffffffeec0
                            );
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
                  std::allocator<char>::~allocator(&local_c93);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
                  std::allocator<char>::~allocator(local_c92);
                  pVar13 = std::
                           map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                           ::emplace<transaction_identifier<true>const&,MempoolAcceptResult_const&>
                                     ((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                                       *)in_stack_ffffffffffffeed8._M_cur,
                                      (transaction_identifier<true> *)
                                      CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
                                      in_stack_ffffffffffffeec8);
                  local_b60 = (_Base_ptr)pVar13.first._M_node;
                  local_b58 = pVar13.second;
                }
              }
              PackageMempoolAcceptResult::~PackageMempoolAcceptResult
                        ((PackageMempoolAcceptResult *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
            }
          }
          __gnu_cxx::
          __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
          ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        }
        bVar2 = false;
        bVar4 = false;
        if ((bVar3) ||
           (bVar3 = std::
                    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ::empty((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                             *)in_stack_ffffffffffffeec8), bVar3)) {
          PackageValidationState::PackageValidationState
                    ((PackageValidationState *)
                     CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                     (PackageValidationState *)0x14bbbea);
          bVar2 = true;
          std::
          map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
          ::map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                 *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
          bVar4 = true;
          PackageMempoolAcceptResult::PackageMempoolAcceptResult
                    ((PackageMempoolAcceptResult *)in_stack_ffffffffffffeec8,
                     (PackageValidationState *)in_stack_ffffffffffffeec0,
                     (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                      *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        }
        else {
          AcceptSubPackage((MemPoolAccept *)in_stack_ffffffffffffef08._M_current,
                           (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)in_stack_ffffffffffffef00._M_current,
                           (ATMPArgs *)in_stack_ffffffffffffeef8);
        }
        if (bVar4) {
          std::
          map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
          ::~map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                  *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        }
        if (bVar2) {
          PackageValidationState::~PackageValidationState
                    ((PackageValidationState *)
                     CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        }
        Chainstate::CoinsTip((Chainstate *)in_stack_ffffffffffffeed8._M_cur);
        LimitMempoolSize(in_stack_ffffffffffffef20,in_stack_ffffffffffffef18);
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)in_stack_ffffffffffffeec0);
        __end1_2 = std::
                   vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          *)in_stack_ffffffffffffeec0);
        while (bVar3 = __gnu_cxx::
                       operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                 ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                   *)in_stack_ffffffffffffeec8,
                                  (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                   *)in_stack_ffffffffffffeec0), ((bVar3 ^ 0xffU) & 1) != 0) {
          __gnu_cxx::
          __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
          ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                       *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
          std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
          __args_1 = (MempoolAcceptResult *)
                     CTransaction::GetWitnessHash
                               ((CTransaction *)
                                CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
          transaction_identifier::operator_cast_to_uint256_
                    ((transaction_identifier<true> *)
                     CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
          sVar9 = std::
                  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                  ::count((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                           *)in_stack_ffffffffffffeec8,(key_type *)in_stack_ffffffffffffeec0);
          if (sVar9 == 0) {
            transaction_identifier::operator_cast_to_uint256_
                      ((transaction_identifier<true> *)
                       CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
            it = std::
                 map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                 ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                         *)in_stack_ffffffffffffeec0,
                        (key_type *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
            local_cc3._3_8_ =
                 std::
                 map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                 ::end((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)in_stack_ffffffffffffeec0);
            bVar3 = std::operator==((_Self *)in_stack_ffffffffffffeec8,
                                    (_Self *)in_stack_ffffffffffffeec0);
            if (((bVar3 ^ 0xffU) & 1) == 0) {
              transaction_identifier::operator_cast_to_uint256_
                        ((transaction_identifier<true> *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              in_stack_ffffffffffffeee0 =
                   std::
                   map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                   ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                           *)in_stack_ffffffffffffeec0,
                          (key_type *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8))
              ;
              std::
              map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
              ::end((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                     *)in_stack_ffffffffffffeec0);
              bVar3 = std::operator==((_Self *)in_stack_ffffffffffffeec8,
                                      (_Self *)in_stack_ffffffffffffeec0);
              if (((bVar3 ^ 0xffU) & 1) != 0) {
                std::_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                          ((_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)
                           CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
                inline_assertion_check<false,bool>
                          ((bool *)in_stack_ffffffffffffeed8._M_cur,
                           (char *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
                           (int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
                           (char *)in_stack_ffffffffffffeec0,
                           (char *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
                std::_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                          ((_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)
                           CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
                pVar13 = std::
                         map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                         ::emplace<transaction_identifier<true>const&,MempoolAcceptResult&>
                                   ((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                                     *)in_stack_ffffffffffffeed8._M_cur,
                                    (transaction_identifier<true> *)
                                    CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
                                    __args_1);
                in_stack_ffffffffffffeed8._M_cur = (__node_type *)pVar13.first._M_node;
                local_ba8 = pVar13.second;
                in_stack_ffffffffffffeed4 = CONCAT13(local_ba8,(int3)in_stack_ffffffffffffeed4);
                in_stack_ffffffffffffeec8 = __args_1;
                local_bb0 = (_Base_ptr)in_stack_ffffffffffffeed8._M_cur;
              }
            }
            else {
              ppVar11 = std::_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::
                        operator->((_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>
                                    *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8))
              ;
              local_cc3[2] = (ppVar11->second).m_result_type != INVALID;
              inline_assertion_check<false,bool>
                        ((bool *)in_stack_ffffffffffffeed8._M_cur,
                         (char *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
                         (int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
                         (char *)in_stack_ffffffffffffeec0,
                         (char *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              transaction_identifier::operator_cast_to_uint256_
                        ((transaction_identifier<true> *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              sVar9 = std::
                      map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                      ::count((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                               *)in_stack_ffffffffffffeec8,(key_type *)in_stack_ffffffffffffeec0);
              local_cc3[1] = sVar9 == 0;
              inline_assertion_check<false,bool>
                        ((bool *)in_stack_ffffffffffffeed8._M_cur,
                         (char *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
                         (int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
                         (char *)in_stack_ffffffffffffeec0,
                         (char *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              CTransaction::GetHash
                        ((CTransaction *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              transaction_identifier::operator_cast_to_uint256_
                        ((transaction_identifier<false> *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              GenTxid::Txid((uint256 *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8)
                           );
              bVar3 = CTxMemPool::exists(in_stack_ffffffffffffef20,
                                         (GenTxid *)in_stack_ffffffffffffef18);
              if (((bVar3 ^ 0xffU) & 1) != 0) {
                in_stack_ffffffffffffef20 = (CTxMemPool *)local_cc3;
                in_stack_ffffffffffffef18 = (CCoinsViewCache *)&multi_submission_result;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffef08._M_current,
                           (char *)in_stack_ffffffffffffef00._M_current,
                           (allocator<char> *)in_stack_ffffffffffffeef8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffef08._M_current,
                           (char *)in_stack_ffffffffffffef00._M_current,
                           (allocator<char> *)in_stack_ffffffffffffeef8);
                ValidationState<PackageValidationResult>::Invalid
                          ((ValidationState<PackageValidationResult> *)
                           in_stack_ffffffffffffeed8._M_cur,in_stack_ffffffffffffeed4,
                           (string *)in_stack_ffffffffffffeec8,(string *)in_stack_ffffffffffffeec0);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
                std::allocator<char>::~allocator(&local_cc4);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
                std::allocator<char>::~allocator((allocator<char> *)local_cc3);
                TxValidationState::TxValidationState
                          ((TxValidationState *)
                           CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
                in_stack_ffffffffffffef08._M_current = (CTxIn *)(local_cc6 + 1);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffef08._M_current,
                           (char *)in_stack_ffffffffffffef00._M_current,
                           (allocator<char> *)in_stack_ffffffffffffeef8);
                in_stack_ffffffffffffef00._M_current = (CTxIn *)local_cc6;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffef08._M_current,
                           (char *)in_stack_ffffffffffffef00._M_current,
                           (allocator<char> *)in_stack_ffffffffffffeef8);
                ValidationState<TxValidationResult>::Invalid
                          ((ValidationState<TxValidationResult> *)in_stack_ffffffffffffeed8._M_cur,
                           in_stack_ffffffffffffeed4,(string *)in_stack_ffffffffffffeec8,
                           (string *)in_stack_ffffffffffffeec0);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
                std::allocator<char>::~allocator((allocator<char> *)local_cc6);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
                std::allocator<char>::~allocator((allocator<char> *)(local_cc6 + 1));
                transaction_identifier::operator_cast_to_uint256_
                          ((transaction_identifier<true> *)
                           CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
                std::
                map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                ::erase((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                         *)in_stack_ffffffffffffeec8,(key_type *)in_stack_ffffffffffffeec0);
                TxValidationState::TxValidationState
                          ((TxValidationState *)
                           CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                           (TxValidationState *)0x14bc6de);
                MempoolAcceptResult::Failure
                          ((TxValidationState *)
                           CONCAT44(in_stack_ffffffffffffeeec,in_stack_ffffffffffffeee8));
                pVar13 = std::
                         map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                         ::emplace<transaction_identifier<true>const&,MempoolAcceptResult>
                                   ((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                                     *)in_stack_ffffffffffffeed8._M_cur,
                                    (transaction_identifier<true> *)
                                    CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
                                    in_stack_ffffffffffffeec8);
                local_ba0 = (_Base_ptr)pVar13.first._M_node;
                local_b98 = pVar13.second;
                in_stack_ffffffffffffeeec = CONCAT13(local_b98,(int3)in_stack_ffffffffffffeeec);
                MempoolAcceptResult::~MempoolAcceptResult
                          ((MempoolAcceptResult *)
                           CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
                TxValidationState::~TxValidationState
                          ((TxValidationState *)
                           CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
                TxValidationState::~TxValidationState
                          ((TxValidationState *)
                           CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
                in_stack_ffffffffffffeef8 = __args_1;
              }
            }
          }
          else {
            transaction_identifier::operator_cast_to_uint256_
                      ((transaction_identifier<true> *)
                       CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
            sVar9 = std::
                    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    ::count((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                             *)in_stack_ffffffffffffeec8,(key_type *)in_stack_ffffffffffffeec0);
            local_ca9 = sVar9 == 0;
            inline_assertion_check<false,bool>
                      ((bool *)in_stack_ffffffffffffeed8._M_cur,
                       (char *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
                       (int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),
                       (char *)in_stack_ffffffffffffeec0,
                       (char *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
            transaction_identifier::operator_cast_to_uint256_
                      ((transaction_identifier<true> *)
                       CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
            pmVar10 = std::
                      map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                      ::at((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                            *)in_stack_ffffffffffffeee0._M_node,
                           (key_type *)in_stack_ffffffffffffeed8._M_cur);
            local_1049 = 0;
            if (pmVar10->m_result_type == VALID) {
              transaction_identifier::operator_cast_to_uint256_
                        ((transaction_identifier<true> *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              GenTxid::Wtxid((uint256 *)
                             CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              bVar3 = CTxMemPool::exists(in_stack_ffffffffffffef20,
                                         (GenTxid *)in_stack_ffffffffffffef18);
              local_1049 = bVar3 ^ 0xff;
            }
            if ((local_1049 & 1) == 0) {
              pVar13 = std::
                       map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                       ::emplace<transaction_identifier<true>const&,MempoolAcceptResult_const&>
                                 ((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                                   *)in_stack_ffffffffffffeed8._M_cur,
                                  (transaction_identifier<true> *)
                                  CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
                                  in_stack_ffffffffffffeec8);
              local_b90 = (_Base_ptr)pVar13.first._M_node;
              local_b88 = pVar13.second;
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffef08._M_current,
                         (char *)in_stack_ffffffffffffef00._M_current,
                         (allocator<char> *)in_stack_ffffffffffffeef8);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffef08._M_current,
                         (char *)in_stack_ffffffffffffef00._M_current,
                         (allocator<char> *)in_stack_ffffffffffffeef8);
              ValidationState<PackageValidationResult>::Invalid
                        ((ValidationState<PackageValidationResult> *)
                         in_stack_ffffffffffffeed8._M_cur,in_stack_ffffffffffffeed4,
                         (string *)in_stack_ffffffffffffeec8,(string *)in_stack_ffffffffffffeec0);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              std::allocator<char>::~allocator(&local_cab);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              std::allocator<char>::~allocator(&local_caa);
              TxValidationState::TxValidationState
                        ((TxValidationState *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffef08._M_current,
                         (char *)in_stack_ffffffffffffef00._M_current,
                         (allocator<char> *)in_stack_ffffffffffffeef8);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffef08._M_current,
                         (char *)in_stack_ffffffffffffef00._M_current,
                         (allocator<char> *)in_stack_ffffffffffffeef8);
              ValidationState<TxValidationResult>::Invalid
                        ((ValidationState<TxValidationResult> *)in_stack_ffffffffffffeed8._M_cur,
                         in_stack_ffffffffffffeed4,(string *)in_stack_ffffffffffffeec8,
                         (string *)in_stack_ffffffffffffeec0);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              std::allocator<char>::~allocator(&local_cad);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              std::allocator<char>::~allocator(&local_cac);
              TxValidationState::TxValidationState
                        ((TxValidationState *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                         (TxValidationState *)0x14bc0cd);
              MempoolAcceptResult::Failure
                        ((TxValidationState *)
                         CONCAT44(in_stack_ffffffffffffeeec,in_stack_ffffffffffffeee8));
              pVar13 = std::
                       map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                       ::emplace<transaction_identifier<true>const&,MempoolAcceptResult>
                                 ((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                                   *)in_stack_ffffffffffffeed8._M_cur,
                                  (transaction_identifier<true> *)
                                  CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
                                  in_stack_ffffffffffffeec8);
              local_b80 = (_Base_ptr)pVar13.first._M_node;
              local_b78 = pVar13.second;
              MempoolAcceptResult::~MempoolAcceptResult
                        ((MempoolAcceptResult *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              TxValidationState::~TxValidationState
                        ((TxValidationState *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
              TxValidationState::~TxValidationState
                        ((TxValidationState *)
                         CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
            }
          }
          __gnu_cxx::
          __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
          ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        }
        state = (PackageValidationState *)
                std::
                map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                ::size((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        inline_assertion_check<false,bool>
                  ((bool *)in_stack_ffffffffffffeed8._M_cur,
                   (char *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
                   (int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),(char *)state,
                   (char *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        PackageValidationState::PackageValidationState
                  ((PackageValidationState *)
                   CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                   (PackageValidationState *)0x14bca6c);
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  ((PackageMempoolAcceptResult *)in_stack_ffffffffffffeec8,state,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        PackageValidationState::~PackageValidationState
                  ((PackageValidationState *)
                   CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        PackageMempoolAcceptResult::~PackageMempoolAcceptResult
                  ((PackageMempoolAcceptResult *)
                   CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)in_stack_ffffffffffffeec8);
        std::
        map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::~map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        std::
        map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::~map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                   CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef08._M_current,(char *)in_stack_ffffffffffffef00._M_current
                   ,(allocator<char> *)in_stack_ffffffffffffeef8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef08._M_current,(char *)in_stack_ffffffffffffef00._M_current
                   ,(allocator<char> *)in_stack_ffffffffffffeef8);
        ValidationState<PackageValidationResult>::Invalid
                  ((ValidationState<PackageValidationResult> *)in_stack_ffffffffffffeed8._M_cur,
                   in_stack_ffffffffffffeed4,(string *)in_stack_ffffffffffffeec8,
                   (string *)in_stack_ffffffffffffeec0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        std::allocator<char>::~allocator(&local_c3a);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        std::allocator<char>::~allocator(&local_c39);
        PackageValidationState::PackageValidationState
                  ((PackageValidationState *)
                   CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                   (PackageValidationState *)0x14bb009);
        std::
        map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
               *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  ((PackageMempoolAcceptResult *)in_stack_ffffffffffffeec8,
                   (PackageValidationState *)in_stack_ffffffffffffeec0,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        std::
        map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::~map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
        PackageValidationState::~PackageValidationState
                  ((PackageValidationState *)
                   CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
      }
      std::
      unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>::
      ~unordered_set((unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
                      *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef08._M_current,(char *)in_stack_ffffffffffffef00._M_current,
                 (allocator<char> *)in_stack_ffffffffffffeef8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef08._M_current,(char *)in_stack_ffffffffffffef00._M_current,
                 (allocator<char> *)in_stack_ffffffffffffeef8);
      ValidationState<PackageValidationResult>::Invalid
                ((ValidationState<PackageValidationResult> *)in_stack_ffffffffffffeed8._M_cur,
                 in_stack_ffffffffffffeed4,(string *)in_stack_ffffffffffffeec8,
                 (string *)in_stack_ffffffffffffeec0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
      std::allocator<char>::~allocator(&local_bb2);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
      std::allocator<char>::~allocator(&local_bb1);
      PackageValidationState::PackageValidationState
                ((PackageValidationState *)
                 CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                 (PackageValidationState *)0x14baaa0);
      std::
      map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
      PackageMempoolAcceptResult::PackageMempoolAcceptResult
                ((PackageMempoolAcceptResult *)in_stack_ffffffffffffeec8,
                 (PackageValidationState *)in_stack_ffffffffffffeec0,
                 (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                  *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
      std::
      map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::~map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
              *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
      PackageValidationState::~PackageValidationState
                ((PackageValidationState *)
                 CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
    }
  }
  else {
    PackageValidationState::PackageValidationState
              ((PackageValidationState *)
               CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
               (PackageValidationState *)0x14ba8d7);
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
    PackageMempoolAcceptResult::PackageMempoolAcceptResult
              ((PackageMempoolAcceptResult *)in_stack_ffffffffffffeec8,
               (PackageValidationState *)in_stack_ffffffffffffeec0,
               (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::~map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
    PackageValidationState::~PackageValidationState
              ((PackageValidationState *)
               CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8));
  }
  PackageValidationState::~PackageValidationState
            ((PackageValidationState *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8)
            );
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

PackageMempoolAcceptResult MemPoolAccept::AcceptPackage(const Package& package, ATMPArgs& args)
{
    AssertLockHeld(cs_main);
    // Used if returning a PackageMempoolAcceptResult directly from this function.
    PackageValidationState package_state_quit_early;

    // Check that the package is well-formed. If it isn't, we won't try to validate any of the
    // transactions and thus won't return any MempoolAcceptResults, just a package-wide error.

    // Context-free package checks.
    if (!IsWellFormedPackage(package, package_state_quit_early, /*require_sorted=*/true)) {
        return PackageMempoolAcceptResult(package_state_quit_early, {});
    }

    // All transactions in the package must be a parent of the last transaction. This is just an
    // opportunity for us to fail fast on a context-free check without taking the mempool lock.
    if (!IsChildWithParents(package)) {
        package_state_quit_early.Invalid(PackageValidationResult::PCKG_POLICY, "package-not-child-with-parents");
        return PackageMempoolAcceptResult(package_state_quit_early, {});
    }

    // IsChildWithParents() guarantees the package is > 1 transactions.
    assert(package.size() > 1);
    // The package must be 1 child with all of its unconfirmed parents. The package is expected to
    // be sorted, so the last transaction is the child.
    const auto& child = package.back();
    std::unordered_set<uint256, SaltedTxidHasher> unconfirmed_parent_txids;
    std::transform(package.cbegin(), package.cend() - 1,
                   std::inserter(unconfirmed_parent_txids, unconfirmed_parent_txids.end()),
                   [](const auto& tx) { return tx->GetHash(); });

    // All child inputs must refer to a preceding package transaction or a confirmed UTXO. The only
    // way to verify this is to look up the child's inputs in our current coins view (not including
    // mempool), and enforce that all parents not present in the package be available at chain tip.
    // Since this check can bring new coins into the coins cache, keep track of these coins and
    // uncache them if we don't end up submitting this package to the mempool.
    const CCoinsViewCache& coins_tip_cache = m_active_chainstate.CoinsTip();
    for (const auto& input : child->vin) {
        if (!coins_tip_cache.HaveCoinInCache(input.prevout)) {
            args.m_coins_to_uncache.push_back(input.prevout);
        }
    }
    // Using the MemPoolAccept m_view cache allows us to look up these same coins faster later.
    // This should be connecting directly to CoinsTip, not to m_viewmempool, because we specifically
    // require inputs to be confirmed if they aren't in the package.
    m_view.SetBackend(m_active_chainstate.CoinsTip());
    const auto package_or_confirmed = [this, &unconfirmed_parent_txids](const auto& input) {
         return unconfirmed_parent_txids.count(input.prevout.hash) > 0 || m_view.HaveCoin(input.prevout);
    };
    if (!std::all_of(child->vin.cbegin(), child->vin.cend(), package_or_confirmed)) {
        package_state_quit_early.Invalid(PackageValidationResult::PCKG_POLICY, "package-not-child-with-unconfirmed-parents");
        return PackageMempoolAcceptResult(package_state_quit_early, {});
    }
    // Protect against bugs where we pull more inputs from disk that miss being added to
    // coins_to_uncache. The backend will be connected again when needed in PreChecks.
    m_view.SetBackend(m_dummy);

    LOCK(m_pool.cs);
    // Stores results from which we will create the returned PackageMempoolAcceptResult.
    // A result may be changed if a mempool transaction is evicted later due to LimitMempoolSize().
    std::map<uint256, MempoolAcceptResult> results_final;
    // Results from individual validation which will be returned if no other result is available for
    // this transaction. "Nonfinal" because if a transaction fails by itself but succeeds later
    // (i.e. when evaluated with a fee-bumping child), the result in this map may be discarded.
    std::map<uint256, MempoolAcceptResult> individual_results_nonfinal;
    bool quit_early{false};
    std::vector<CTransactionRef> txns_package_eval;
    for (const auto& tx : package) {
        const auto& wtxid = tx->GetWitnessHash();
        const auto& txid = tx->GetHash();
        // There are 3 possibilities: already in mempool, same-txid-diff-wtxid already in mempool,
        // or not in mempool. An already confirmed tx is treated as one not in mempool, because all
        // we know is that the inputs aren't available.
        if (m_pool.exists(GenTxid::Wtxid(wtxid))) {
            // Exact transaction already exists in the mempool.
            // Node operators are free to set their mempool policies however they please, nodes may receive
            // transactions in different orders, and malicious counterparties may try to take advantage of
            // policy differences to pin or delay propagation of transactions. As such, it's possible for
            // some package transaction(s) to already be in the mempool, and we don't want to reject the
            // entire package in that case (as that could be a censorship vector). De-duplicate the
            // transactions that are already in the mempool, and only call AcceptMultipleTransactions() with
            // the new transactions. This ensures we don't double-count transaction counts and sizes when
            // checking ancestor/descendant limits, or double-count transaction fees for fee-related policy.
            const auto& entry{*Assert(m_pool.GetEntry(txid))};
            results_final.emplace(wtxid, MempoolAcceptResult::MempoolTx(entry.GetTxSize(), entry.GetFee()));
        } else if (m_pool.exists(GenTxid::Txid(txid))) {
            // Transaction with the same non-witness data but different witness (same txid,
            // different wtxid) already exists in the mempool.
            //
            // We don't allow replacement transactions right now, so just swap the package
            // transaction for the mempool one. Note that we are ignoring the validity of the
            // package transaction passed in.
            // TODO: allow witness replacement in packages.
            const auto& entry{*Assert(m_pool.GetEntry(txid))};
            // Provide the wtxid of the mempool tx so that the caller can look it up in the mempool.
            results_final.emplace(wtxid, MempoolAcceptResult::MempoolTxDifferentWitness(entry.GetTx().GetWitnessHash()));
        } else {
            // Transaction does not already exist in the mempool.
            // Try submitting the transaction on its own.
            const auto single_package_res = AcceptSubPackage({tx}, args);
            const auto& single_res = single_package_res.m_tx_results.at(wtxid);
            if (single_res.m_result_type == MempoolAcceptResult::ResultType::VALID) {
                // The transaction succeeded on its own and is now in the mempool. Don't include it
                // in package validation, because its fees should only be "used" once.
                assert(m_pool.exists(GenTxid::Wtxid(wtxid)));
                results_final.emplace(wtxid, single_res);
            } else if (single_res.m_state.GetResult() != TxValidationResult::TX_RECONSIDERABLE &&
                       single_res.m_state.GetResult() != TxValidationResult::TX_MISSING_INPUTS) {
                // Package validation policy only differs from individual policy in its evaluation
                // of feerate. For example, if a transaction fails here due to violation of a
                // consensus rule, the result will not change when it is submitted as part of a
                // package. To minimize the amount of repeated work, unless the transaction fails
                // due to feerate or missing inputs (its parent is a previous transaction in the
                // package that failed due to feerate), don't run package validation. Note that this
                // decision might not make sense if different types of packages are allowed in the
                // future.  Continue individually validating the rest of the transactions, because
                // some of them may still be valid.
                quit_early = true;
                package_state_quit_early.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
                individual_results_nonfinal.emplace(wtxid, single_res);
            } else {
                individual_results_nonfinal.emplace(wtxid, single_res);
                txns_package_eval.push_back(tx);
            }
        }
    }

    auto multi_submission_result = quit_early || txns_package_eval.empty() ? PackageMempoolAcceptResult(package_state_quit_early, {}) :
        AcceptSubPackage(txns_package_eval, args);
    PackageValidationState& package_state_final = multi_submission_result.m_state;

    // Make sure we haven't exceeded max mempool size.
    // Package transactions that were submitted to mempool or already in mempool may be evicted.
    LimitMempoolSize(m_pool, m_active_chainstate.CoinsTip());

    for (const auto& tx : package) {
        const auto& wtxid = tx->GetWitnessHash();
        if (multi_submission_result.m_tx_results.count(wtxid) > 0) {
            // We shouldn't have re-submitted if the tx result was already in results_final.
            Assume(results_final.count(wtxid) == 0);
            // If it was submitted, check to see if the tx is still in the mempool. It could have
            // been evicted due to LimitMempoolSize() above.
            const auto& txresult = multi_submission_result.m_tx_results.at(wtxid);
            if (txresult.m_result_type == MempoolAcceptResult::ResultType::VALID && !m_pool.exists(GenTxid::Wtxid(wtxid))) {
                package_state_final.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
                TxValidationState mempool_full_state;
                mempool_full_state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "mempool full");
                results_final.emplace(wtxid, MempoolAcceptResult::Failure(mempool_full_state));
            } else {
                results_final.emplace(wtxid, txresult);
            }
        } else if (const auto it{results_final.find(wtxid)}; it != results_final.end()) {
            // Already-in-mempool transaction. Check to see if it's still there, as it could have
            // been evicted when LimitMempoolSize() was called.
            Assume(it->second.m_result_type != MempoolAcceptResult::ResultType::INVALID);
            Assume(individual_results_nonfinal.count(wtxid) == 0);
            // Query by txid to include the same-txid-different-witness ones.
            if (!m_pool.exists(GenTxid::Txid(tx->GetHash()))) {
                package_state_final.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
                TxValidationState mempool_full_state;
                mempool_full_state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "mempool full");
                // Replace the previous result.
                results_final.erase(wtxid);
                results_final.emplace(wtxid, MempoolAcceptResult::Failure(mempool_full_state));
            }
        } else if (const auto it{individual_results_nonfinal.find(wtxid)}; it != individual_results_nonfinal.end()) {
            Assume(it->second.m_result_type == MempoolAcceptResult::ResultType::INVALID);
            // Interesting result from previous processing.
            results_final.emplace(wtxid, it->second);
        }
    }
    Assume(results_final.size() == package.size());
    return PackageMempoolAcceptResult(package_state_final, std::move(results_final));
}